

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O3

int archive_write_ustar_header(archive_write *a,archive_entry *entry)

{
  la_int64_t *plVar1;
  mode_t mVar2;
  int iVar3;
  int iVar4;
  archive_string_conv *sconv;
  char *pcVar5;
  size_t sVar6;
  archive_string *paVar7;
  la_int64_t lVar8;
  char buff [512];
  archive_string local_238 [21];
  
  plVar1 = (la_int64_t *)a->format_data;
  sconv = (archive_string_conv *)plVar1[2];
  if (sconv == (archive_string_conv *)0x0) {
    if ((int)plVar1[4] == 0) {
      sconv = archive_string_default_conversion_for_write(&a->archive);
      plVar1[3] = (la_int64_t)sconv;
      *(undefined4 *)(plVar1 + 4) = 1;
    }
    else {
      sconv = (archive_string_conv *)plVar1[3];
    }
  }
  pcVar5 = archive_entry_pathname(entry);
  if (pcVar5 != (char *)0x0) {
    pcVar5 = archive_entry_hardlink(entry);
    if (((pcVar5 != (char *)0x0) || (pcVar5 = archive_entry_symlink(entry), pcVar5 != (char *)0x0))
       || (mVar2 = archive_entry_filetype(entry), mVar2 != 0x8000)) {
      archive_entry_set_size(entry,0);
    }
    mVar2 = archive_entry_filetype(entry);
    if (((mVar2 == 0x4000) && (pcVar5 = archive_entry_pathname(entry), pcVar5 != (char *)0x0)) &&
       ((*pcVar5 != '\0' && (sVar6 = strlen(pcVar5), pcVar5[sVar6 - 1] != '/')))) {
      local_238[0].s = (char *)0x0;
      local_238[0].length = 0;
      local_238[0].buffer_length = 0;
      sVar6 = strlen(pcVar5);
      paVar7 = archive_string_ensure(local_238,sVar6 + 2);
      if (paVar7 == (archive_string *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate ustar data");
        archive_string_free(local_238);
        return -0x1e;
      }
      local_238[0].length = 0;
      archive_strncat(local_238,pcVar5,sVar6);
      archive_strappend_char(local_238,'/');
      archive_entry_copy_pathname(entry,local_238[0].s);
      archive_string_free(local_238);
    }
    iVar3 = __archive_write_format_header_ustar(a,(char *)local_238,entry,-1,1,sconv);
    if (-0x15 < iVar3) {
      iVar4 = __archive_write_output(a,local_238,0x200);
      if (iVar4 < -0x14) {
        archive_entry_free((archive_entry *)0x0);
        return iVar4;
      }
      if (iVar4 < iVar3) {
        iVar3 = iVar4;
      }
      lVar8 = archive_entry_size(entry);
      *plVar1 = lVar8;
      plVar1[1] = (ulong)(-(int)lVar8 & 0x1ff);
    }
    archive_entry_free((archive_entry *)0x0);
    return iVar3;
  }
  archive_set_error(&a->archive,-1,"Can\'t record entry in tar file without pathname");
  return -0x19;
}

Assistant:

static int
archive_write_ustar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct ustar *ustar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	ustar = (struct ustar *)a->format_data;

	/* Setup default string conversion. */
	if (ustar->opt_sconv == NULL) {
		if (!ustar->init_default_conversion) {
			ustar->sconv_default =
			    archive_string_default_conversion_for_write(&(a->archive));
			ustar->init_default_conversion = 1;
		}
		sconv = ustar->sconv_default;
	} else
		sconv = ustar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = __archive_write_format_header_ustar(a, buff, entry, -1, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	ustar->entry_bytes_remaining = archive_entry_size(entry);
	ustar->entry_padding = 0x1ff & (-(int64_t)ustar->entry_bytes_remaining);
	archive_entry_free(entry_main);
	return (ret);
}